

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermo.cpp
# Opt level: O2

void __thiscall
IO::Thermo::setLowerTemperatureCoefficients
          (Thermo *this,double al1,double al2,double al3,double al4,double al5,double al6,double al7
          )

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pdVar1;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  this_00 = &this->al_;
  pdVar1 = (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  local_40 = al7;
  local_38 = al6;
  local_30 = al5;
  local_28 = al4;
  local_20 = al3;
  local_18 = al2;
  local_10 = al1;
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_10);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_18);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_20);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_28);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_30);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_38);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_40);
  return;
}

Assistant:

void IO::Thermo::setLowerTemperatureCoefficients(
        double al1, double al2, double al3,
        double al4, double al5,
        double al6, double al7) {
    al_.clear();
    al_.push_back(al1);
    al_.push_back(al2);
    al_.push_back(al3);
    al_.push_back(al4);
    al_.push_back(al5);
    al_.push_back(al6);
    al_.push_back(al7);
}